

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

char * fits_find_match_delim(char *string,char delim)

{
  int local_2c;
  char *pcStack_28;
  int retval;
  char *tstr;
  char *pcStack_18;
  char delim_local;
  char *string_local;
  
  if (string == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    pcStack_28 = string;
    tstr._7_1_ = delim;
    pcStack_18 = string;
    if (delim == '\"') {
      local_2c = find_doublequote(&stack0xffffffffffffffd8);
    }
    else if (delim == '\'') {
      local_2c = find_quote(&stack0xffffffffffffffd8);
    }
    else if (delim == ')') {
      local_2c = find_paren(&stack0xffffffffffffffd8);
    }
    else if (delim == ']') {
      local_2c = find_bracket(&stack0xffffffffffffffd8);
    }
    else {
      if (delim != '}') {
        return (char *)0x0;
      }
      local_2c = find_curlybracket(&stack0xffffffffffffffd8);
    }
    if (local_2c == 0) {
      string_local = pcStack_28;
    }
    else {
      string_local = (char *)0x0;
    }
  }
  return string_local;
}

Assistant:

char *fits_find_match_delim(char *string, char delim)
/*
  Find matching delimiter, respecting quoting and (potentially nested) parentheses
  
  char *string - null-terminated string to be searched for delimiter
  char delim - single delimiter to search for (one of '")]} )

  returns: pointer to character after delimiter, or 0 if not found
*/
{
  char *tstr = string;
  int retval = 0;

  if (!string) return 0;
  switch (delim) {
  case '\'': retval = find_quote(&tstr); break;
  case '"':  retval = find_doublequote(&tstr); break;
  case '}':  retval = find_curlybracket(&tstr); break;
  case ']':  retval = find_bracket(&tstr); break;
  case ')':  retval = find_paren(&tstr); break;
  default: return 0; /* Invalid delimeter, return failure */
  }

  /* Delimeter not found, return failure */
  if (retval) return 0;

  /* Delimeter was found, return next position */
  return (tstr);
}